

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

float GD::finalize_prediction(shared_data *sd,float ret)

{
  ostream *poVar1;
  float fVar2;
  
  if ((~(uint)ret & 0x7fc00000) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"NAN prediction in example ",0x1a);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", forcing ",10);
    poVar1 = std::ostream::_M_insert<double>(0.0);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    fVar2 = 0.0;
  }
  else {
    fVar2 = sd->max_label;
    if ((ret <= sd->max_label) && (fVar2 = sd->min_label, sd->min_label <= ret)) {
      fVar2 = ret;
    }
  }
  return fVar2;
}

Assistant:

float finalize_prediction(shared_data* sd, float ret)
{
  if (nanpattern(ret))
  {
    ret = 0.;
    cerr << "NAN prediction in example " << sd->example_number + 1 << ", forcing " << ret << endl;
    return ret;
  }
  if (ret > sd->max_label)
    return (float)sd->max_label;
  if (ret < sd->min_label)
    return (float)sd->min_label;
  return ret;
}